

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
* toml::detail::parse_comment_line<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  char_type_conflict cVar2;
  context<toml::type_config> *in_RDX;
  result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
  *in_RDI;
  region com_reg;
  location first;
  spec *spec;
  location *in_stack_fffffffffffffb88;
  source_location *in_stack_fffffffffffffb90;
  size_t in_stack_fffffffffffffb98;
  location *in_stack_fffffffffffffba0;
  location *in_stack_fffffffffffffba8;
  undefined5 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb5;
  undefined1 in_stack_fffffffffffffbb6;
  undefined1 in_stack_fffffffffffffbb7;
  byte bVar3;
  result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
  *loc_00;
  either *in_stack_fffffffffffffbc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd0;
  spec *in_stack_fffffffffffffbd8;
  region *in_stack_fffffffffffffbe8;
  location *in_stack_fffffffffffffbf8;
  region *in_stack_fffffffffffffc00;
  region *in_stack_fffffffffffffc08;
  _Alloc_hider in_stack_fffffffffffffc10;
  undefined8 in_stack_fffffffffffffc28;
  location *in_stack_fffffffffffffc30;
  location *in_stack_fffffffffffffc80;
  sequence *in_stack_fffffffffffffc88;
  allocator<char> local_369 [233];
  char (*in_stack_fffffffffffffd80) [65];
  string *in_stack_fffffffffffffd88;
  source_location *in_stack_fffffffffffffd90;
  string *in_stack_fffffffffffffd98;
  
  loc_00 = in_RDI;
  context<toml::type_config>::toml_spec(in_RDX);
  location::location((location *)
                     CONCAT17(in_stack_fffffffffffffbb7,
                              CONCAT16(in_stack_fffffffffffffbb6,
                                       CONCAT15(in_stack_fffffffffffffbb5,in_stack_fffffffffffffbb0)
                                      )),in_stack_fffffffffffffba8);
  skip_whitespace<toml::type_config>
            (in_stack_fffffffffffffc30,(context<toml::type_config> *)in_stack_fffffffffffffc28);
  syntax::comment((spec *)in_stack_fffffffffffffbe8);
  sequence::scan(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  sequence::~sequence((sequence *)in_stack_fffffffffffffb90);
  bVar1 = region::is_ok((region *)0x646fad);
  if (bVar1) {
    bVar1 = location::eof((location *)in_stack_fffffffffffffb90);
    bVar3 = 0;
    if (!bVar1) {
      syntax::newline(in_stack_fffffffffffffbd8);
      either::scan(in_stack_fffffffffffffbc8,(location *)loc_00);
      bVar1 = region::is_ok((region *)0x647033);
      bVar3 = bVar1 ^ 0xff;
      region::~region((region *)in_stack_fffffffffffffb90);
      either::~either((either *)in_stack_fffffffffffffb90);
    }
    if ((bVar3 & 1) == 0) {
      region::as_string_abi_cxx11_(in_stack_fffffffffffffbe8);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffb90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb88);
      ok<std::optional<std::__cxx11::string>>
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_RDI);
      result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
      ::result((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                *)in_stack_fffffffffffffb90,(success_type *)in_stack_fffffffffffffb88);
      success<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~success((success<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x647442);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x64744f);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb90);
    }
    else {
      do {
        bVar1 = location::eof((location *)in_stack_fffffffffffffb90);
        if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_00647175;
        location::advance(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
        cVar2 = location::current(in_stack_fffffffffffffb88);
      } while (cVar2 != '\n');
      location::advance(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
LAB_00647175:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8,
                 (allocator<char> *)loc_00);
      region::region(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      source_location::source_location
                ((source_location *)in_stack_fffffffffffffc10._M_p,in_stack_fffffffffffffc08);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8,
                 (allocator<char> *)loc_00);
      make_error_info<char_const(&)[65]>
                (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                 in_stack_fffffffffffffd80);
      err<toml::error_info>((error_info *)in_stack_fffffffffffffbe8);
      result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
      ::result((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                *)in_stack_fffffffffffffb90,(failure_type *)in_stack_fffffffffffffb88);
      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x647263);
      error_info::~error_info((error_info *)in_stack_fffffffffffffb90);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb90);
      std::allocator<char>::~allocator(local_369);
      source_location::~source_location(in_stack_fffffffffffffb90);
      region::~region((region *)in_stack_fffffffffffffb90);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb90);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd9f);
    }
  }
  else {
    location::operator=((location *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
    cxx::make_nullopt();
    in_stack_fffffffffffffb90 = (source_location *)&stack0xfffffffffffffbd0;
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    ok<std::optional<std::__cxx11::string>>
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_RDI);
    result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
    ::result((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
              *)in_stack_fffffffffffffb90,(success_type *)in_stack_fffffffffffffb88);
    success<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~success((success<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x64751b);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x647525);
  }
  region::~region((region *)in_stack_fffffffffffffb90);
  location::~location((location *)in_stack_fffffffffffffb90);
  return loc_00;
}

Assistant:

result<cxx::optional<std::string>, error_info>
parse_comment_line(location& loc, context<TC>& ctx)
{
    const auto& spec = ctx.toml_spec();
    const auto first = loc;

    skip_whitespace(loc, ctx);

    const auto com_reg = syntax::comment(spec).scan(loc);
    if(com_reg.is_ok())
    {
        // once comment started, newline must follow (or reach EOF).
        if( ! loc.eof() && ! syntax::newline(spec).scan(loc).is_ok())
        {
            while( ! loc.eof()) // skip until newline to continue parsing
            {
                loc.advance();
                if(loc.current() == '\n') { /*skip LF*/ loc.advance(); break; }
            }
            return err(make_error_info("toml::parse_comment_line: "
                "newline (LF / CRLF) or EOF is expected",
                source_location(region(loc)), "but got this",
                "Hint: most of the control characters are not allowed in comments"));
        }
        return ok(cxx::optional<std::string>(com_reg.as_string()));
    }
    else
    {
        loc = first; // rollback whitespace to parse indent
        return ok(cxx::optional<std::string>(cxx::make_nullopt()));
    }
}